

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

void Mpm_ManPerformRound(Mpm_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  int *__dest;
  int *__src;
  Mig_Obj_t *pMVar4;
  abctime aVar5;
  bool bVar6;
  int local_68;
  int local_24;
  int i;
  abctime clk;
  Mig_Obj_t *pObj;
  Mpm_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Vec_IntSize(&p->vMigRefs);
  iVar2 = Vec_IntSize(&p->pMig->vRefs);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x32d,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  __dest = Vec_IntArray(&p->vMigRefs);
  __src = Vec_IntArray(&p->pMig->vRefs);
  iVar1 = Mig_ManObjNum(p->pMig);
  memcpy(__dest,__src,(long)iVar1 << 2);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(&p->pMig->vCos);
    bVar6 = false;
    if (local_24 < iVar1) {
      clk = (abctime)Mig_ManCo(p->pMig,local_24);
      bVar6 = (Mig_Obj_t *)clk != (Mig_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pMVar4 = Mig_ObjFanin0((Mig_Obj_t *)clk);
    Mig_ObjMigRefDec(p,pMVar4);
    local_24 = local_24 + 1;
  }
  p->nCutsMerged = 0;
  p->pMig->iPage = 0;
  while( true ) {
    iVar1 = p->pMig->iPage;
    iVar2 = Vec_PtrSize(&p->pMig->vPages);
    bVar6 = false;
    if (iVar1 < iVar2) {
      pMVar4 = (Mig_Obj_t *)Vec_PtrEntry(&p->pMig->vPages,p->pMig->iPage);
      p->pMig->pPage = pMVar4;
      bVar6 = pMVar4 != (Mig_Obj_t *)0x0;
    }
    if (!bVar6) break;
    clk = (abctime)p->pMig->pPage;
    while (iVar1 = Mig_ObjIsNone((Mig_Obj_t *)clk), iVar1 == 0) {
      iVar1 = Mig_ObjIsNode((Mig_Obj_t *)clk);
      if (iVar1 != 0) {
        Mpm_ManDeriveCuts(p,(Mig_Obj_t *)clk);
      }
      clk = clk + 0x10;
    }
    p->pMig->iPage = p->pMig->iPage + 1;
  }
  iVar1 = Mig_ManCandNum(p->pMig);
  if (iVar1 != p->pManCuts->nEntries) {
    __assert_fail("Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x335,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  Mpm_ManFinalizeRound(p);
  if (p->pPars->fVerbose != 0) {
    if (p->vTtMem == (Vec_Mem_t *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = p->vTtMem->nEntries;
    }
    printf("Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ",
           (ulong)(uint)p->GloRequired,p->GloArea & 0xffffffff,p->GloEdge & 0xffffffff,
           (ulong)(uint)p->nCutsMerged,(ulong)(uint)p->pManCuts->nEntriesMax,local_68,p->nSmallSupp)
    ;
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar5 - aVar3);
  }
  return;
}

Assistant:

void Mpm_ManPerformRound( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    abctime clk = Abc_Clock();
    int i;
    // copy references
    assert( Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs) );
    memcpy( Vec_IntArray(&p->vMigRefs), Vec_IntArray(&p->pMig->vRefs), sizeof(int) * Mig_ManObjNum(p->pMig) );
    Mig_ManForEachCo( p->pMig, pObj, i )
        Mig_ObjMigRefDec( p, Mig_ObjFanin0(pObj) );
    // derive cuts
    p->nCutsMerged = 0;
    Mig_ManForEachNode( p->pMig, pObj )
        Mpm_ManDeriveCuts( p, pObj );
    assert( Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries );
    Mpm_ManFinalizeRound( p );
    // report results
    if ( p->pPars->fVerbose )
    {
    printf( "Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ", 
        p->GloRequired, (int)p->GloArea, (int)p->GloEdge, 
        p->nCutsMerged, p->pManCuts->nEntriesMax, 
        p->vTtMem ? p->vTtMem->nEntries : 0, p->nSmallSupp );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}